

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateEqualsAndHashCode
          (ImmutableMessageGenerator *this,Printer *printer)

{
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OneofDescriptor *pOVar2;
  btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
  *this_01;
  bool bVar3;
  FieldGeneratorInfo *pFVar4;
  ImmutableFieldGenerator *pIVar5;
  reference ppVar6;
  OneofGeneratorInfo *pOVar7;
  Nonnull<char_*> pcVar8;
  Descriptor *pDVar9;
  char *pcVar10;
  long lVar11;
  size_t sVar12;
  FieldDescriptor *pFVar13;
  long lVar14;
  ImmutableMessageGenerator *pIVar15;
  iterator iVar16;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  const_iterator other;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  string_view text_22;
  string_view text_23;
  string_view text_24;
  string_view text_25;
  string_view text_26;
  const_iterator other_00;
  string_view text_27;
  string_view text_28;
  string_view text_29;
  string_view text_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
  *local_90;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *local_88;
  ImmutableMessageGenerator *local_80;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
  local_78;
  btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
  *local_68;
  string local_60;
  
  text._M_str = "@java.lang.Override\npublic boolean equals(";
  text._M_len = 0x2a;
  io::Printer::Print<>(printer,text);
  if ((this->context_->options_).opensource_runtime == false) {
    text_00._M_str = "@com.google.protobuf.Internal.ProtoMethodAcceptsNullParameter\n";
    text_00._M_len = 0x3e;
    io::Printer::Print<>(printer,text_00);
  }
  text_01._M_str = "final java.lang.Object obj) {\n";
  text_01._M_len = 0x1e;
  io::Printer::Print<>(printer,text_01);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_60,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
  text_02._M_str =
       "if (obj == this) {\n return true;\n}\nif (!(obj instanceof $classname$)) {\n  return super.equals(obj);\n}\n$classname$ other = ($classname$) obj;\n\n"
  ;
  text_02._M_len = 0x8e;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_02,(char (*) [10])0x13005f3,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  pDVar9 = (this->super_MessageGenerator).descriptor_;
  if (0 < pDVar9->field_count_) {
    lVar11 = 0;
    lVar14 = 0;
    do {
      pFVar13 = (FieldDescriptor *)(&pDVar9->fields_->super_SymbolBase + lVar11);
      bVar3 = IsRealOneof(pFVar13);
      if (!bVar3) {
        pFVar4 = Context::GetFieldGeneratorInfo(this->context_,pFVar13);
        bVar3 = FieldDescriptor::has_presence(pFVar13);
        if (bVar3) {
          text_03._M_str =
               "if (has$name$() != other.has$name$()) return false;\nif (has$name$()) {\n";
          text_03._M_len = 0x47;
          io::Printer::Print<char[5],std::__cxx11::string>
                    (printer,text_03,(char (*) [5])0x10a9ad3,&pFVar4->capitalized_name);
          printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
        }
        pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (&this->field_generators_,pFVar13);
        (*(pIVar5->super_FieldGenerator)._vptr_FieldGenerator[0x12])(pIVar5,printer);
        bVar3 = FieldDescriptor::has_presence(pFVar13);
        if (bVar3) {
          io::Printer::Outdent(printer);
          text_04._M_str = "}\n";
          text_04._M_len = 2;
          io::Printer::Print<>(printer,text_04);
        }
      }
      lVar14 = lVar14 + 1;
      pDVar9 = (this->super_MessageGenerator).descriptor_;
      lVar11 = lVar11 + 0x58;
    } while (lVar14 < pDVar9->field_count_);
  }
  this_00 = &(this->super_MessageGenerator).oneofs_;
  iVar16 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                    *)this_00);
  local_78.node_ =
       (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
        *)iVar16.node_;
  local_78.position_ = iVar16.position_;
  local_68 = (btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
              *)this_00;
  iVar16 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::end((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                  *)this_00);
  local_90 = iVar16.node_;
  other.position_ = iVar16.position_;
  bVar3 = absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
          ::Equals(&local_78,(const_iterator)iVar16);
  local_80 = this;
  if (!bVar3) {
    local_88 = &this->field_generators_;
    do {
      pIVar15 = local_80;
      ppVar6 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
               ::operator*(&local_78);
      pOVar2 = ppVar6->second;
      pOVar7 = Context::GetOneofGeneratorInfo(pIVar15->context_,pOVar2);
      text_05._M_str =
           "if (!get$oneof_capitalized_name$Case().equals(other.get$oneof_capitalized_name$Case())) return false;\n"
      ;
      text_05._M_len = 0x66;
      io::Printer::Print<char[23],std::__cxx11::string>
                (printer,text_05,(char (*) [23])"oneof_capitalized_name",&pOVar7->capitalized_name);
      pOVar7 = Context::GetOneofGeneratorInfo(pIVar15->context_,pOVar2);
      text_06._M_str = "switch ($oneof_name$Case_) {\n";
      text_06._M_len = 0x1d;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,text_06,(char (*) [11])0x12e0c8e,&pOVar7->name);
      printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
      if (0 < pOVar2->field_count_) {
        lVar11 = 0;
        lVar14 = 0;
        do {
          pFVar13 = pOVar2->fields_;
          paVar1 = &local_60.field_2;
          pcVar8 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                             (*(int32_t *)((long)&pFVar13->number_ + lVar11),paVar1->_M_local_buf);
          local_60._M_dataplus._M_p = pcVar8 + -(long)paVar1;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          local_60._M_string_length = (size_type)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,paVar1,pcVar8);
          text_07._M_str = "case $field_number$:\n";
          text_07._M_len = 0x15;
          io::Printer::Print<char[13],std::__cxx11::string>
                    (printer,text_07,(char (*) [13])0x12d509b,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
          pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                             (local_88,(FieldDescriptor *)(&pFVar13->super_SymbolBase + lVar11));
          (*(pIVar5->super_FieldGenerator)._vptr_FieldGenerator[0x12])(pIVar5,printer);
          text_08._M_str = "break;\n";
          text_08._M_len = 7;
          io::Printer::Print<>(printer,text_08);
          io::Printer::Outdent(printer);
          lVar14 = lVar14 + 1;
          lVar11 = lVar11 + 0x58;
        } while (lVar14 < pOVar2->field_count_);
      }
      text_09._M_str = "case 0:\ndefault:\n";
      text_09._M_len = 0x11;
      io::Printer::Print<>(printer,text_09);
      io::Printer::Outdent(printer);
      text_10._M_str = "}\n";
      text_10._M_len = 2;
      io::Printer::Print<>(printer,text_10);
      absl::lts_20250127::container_internal::
      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
      ::increment(&local_78);
      other.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                     *)local_90;
      other._12_4_ = 0;
      bVar3 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
              ::Equals(&local_78,other);
    } while (!bVar3);
  }
  pIVar15 = local_80;
  text_11._M_str = "if (!getUnknownFields().equals(other.getUnknownFields())) return false;\n";
  text_11._M_len = 0x48;
  io::Printer::Print<>(printer,text_11);
  if (0 < ((pIVar15->super_MessageGenerator).descriptor_)->extension_range_count_) {
    text_12._M_str =
         "if (!getExtensionFields().equals(other.getExtensionFields()))\n  return false;\n";
    text_12._M_len = 0x4e;
    io::Printer::Print<>(printer,text_12);
  }
  text_13._M_str = "return true;\n";
  text_13._M_len = 0xd;
  io::Printer::Print<>(printer,text_13);
  io::Printer::Outdent(printer);
  text_14._M_str = "}\n\n";
  text_14._M_len = 3;
  io::Printer::Print<>(printer,text_14);
  text_15._M_str = "@java.lang.Override\npublic int hashCode() {\n";
  text_15._M_len = 0x2c;
  io::Printer::Print<>(printer,text_15);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  text_16._M_str = "if (memoizedHashCode != 0) {\n";
  text_16._M_len = 0x1d;
  io::Printer::Print<>(printer,text_16);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  text_17._M_str = "return memoizedHashCode;\n";
  text_17._M_len = 0x19;
  io::Printer::Print<>(printer,text_17);
  io::Printer::Outdent(printer);
  text_18._M_str = "}\nint hash = 41;\n";
  text_18._M_len = 0x11;
  io::Printer::Print<>(printer,text_18);
  if ((((pIVar15->super_MessageGenerator).descriptor_)->options_->field_0)._impl_.
      no_standard_descriptor_accessor_ == true) {
    pcVar10 = "hash = (19 * hash) + getDescriptorForType().hashCode();\n";
    sVar12 = 0x38;
  }
  else {
    pcVar10 = "hash = (19 * hash) + getDescriptor().hashCode();\n";
    sVar12 = 0x31;
  }
  text_19._M_str = pcVar10;
  text_19._M_len = sVar12;
  io::Printer::Print<>(printer,text_19);
  pDVar9 = (pIVar15->super_MessageGenerator).descriptor_;
  if (0 < pDVar9->field_count_) {
    lVar11 = 0;
    lVar14 = 0;
    do {
      pFVar13 = (FieldDescriptor *)(&pDVar9->fields_->super_SymbolBase + lVar11);
      bVar3 = IsRealOneof(pFVar13);
      if (!bVar3) {
        pFVar4 = Context::GetFieldGeneratorInfo(pIVar15->context_,pFVar13);
        bVar3 = FieldDescriptor::has_presence(pFVar13);
        if (bVar3) {
          text_20._M_str = "if (has$name$()) {\n";
          text_20._M_len = 0x13;
          io::Printer::Print<char[5],std::__cxx11::string>
                    (printer,text_20,(char (*) [5])0x10a9ad3,&pFVar4->capitalized_name);
          printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
        }
        pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (&pIVar15->field_generators_,pFVar13);
        (*(pIVar5->super_FieldGenerator)._vptr_FieldGenerator[0x13])(pIVar5,printer);
        bVar3 = FieldDescriptor::has_presence(pFVar13);
        if (bVar3) {
          io::Printer::Outdent(printer);
          text_21._M_str = "}\n";
          text_21._M_len = 2;
          io::Printer::Print<>(printer,text_21);
        }
      }
      lVar14 = lVar14 + 1;
      pDVar9 = (pIVar15->super_MessageGenerator).descriptor_;
      lVar11 = lVar11 + 0x58;
    } while (lVar14 < pDVar9->field_count_);
  }
  this_01 = local_68;
  iVar16 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::begin(local_68);
  local_78.node_ =
       (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
        *)iVar16.node_;
  local_78.position_ = iVar16.position_;
  iVar16 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::end(this_01);
  local_90 = iVar16.node_;
  other_00.position_ = iVar16.position_;
  bVar3 = absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
          ::Equals(&local_78,(const_iterator)iVar16);
  if (!bVar3) {
    local_88 = &pIVar15->field_generators_;
    do {
      ppVar6 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
               ::operator*(&local_78);
      pOVar2 = ppVar6->second;
      pOVar7 = Context::GetOneofGeneratorInfo(pIVar15->context_,pOVar2);
      text_22._M_str = "switch ($oneof_name$Case_) {\n";
      text_22._M_len = 0x1d;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,text_22,(char (*) [11])0x12e0c8e,&pOVar7->name);
      printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
      if (0 < pOVar2->field_count_) {
        lVar14 = 0;
        lVar11 = 0;
        do {
          pFVar13 = pOVar2->fields_;
          paVar1 = &local_60.field_2;
          pcVar8 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                             (*(int32_t *)((long)&pFVar13->number_ + lVar14),paVar1->_M_local_buf);
          local_60._M_dataplus._M_p = pcVar8 + -(long)paVar1;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          local_60._M_string_length = (size_type)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,paVar1,pcVar8);
          text_23._M_str = "case $field_number$:\n";
          text_23._M_len = 0x15;
          io::Printer::Print<char[13],std::__cxx11::string>
                    (printer,text_23,(char (*) [13])0x12d509b,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
          pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                             (local_88,(FieldDescriptor *)(&pFVar13->super_SymbolBase + lVar14));
          (*(pIVar5->super_FieldGenerator)._vptr_FieldGenerator[0x13])(pIVar5,printer);
          text_24._M_str = "break;\n";
          text_24._M_len = 7;
          io::Printer::Print<>(printer,text_24);
          io::Printer::Outdent(printer);
          lVar11 = lVar11 + 1;
          lVar14 = lVar14 + 0x58;
        } while (lVar11 < pOVar2->field_count_);
      }
      text_25._M_str = "case 0:\ndefault:\n";
      text_25._M_len = 0x11;
      io::Printer::Print<>(printer,text_25);
      io::Printer::Outdent(printer);
      text_26._M_str = "}\n";
      text_26._M_len = 2;
      io::Printer::Print<>(printer,text_26);
      absl::lts_20250127::container_internal::
      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
      ::increment(&local_78);
      other_00.node_ =
           (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
            *)local_90;
      other_00._12_4_ = 0;
      bVar3 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
              ::Equals(&local_78,other_00);
      pIVar15 = local_80;
    } while (!bVar3);
  }
  if (0 < ((pIVar15->super_MessageGenerator).descriptor_)->extension_range_count_) {
    text_27._M_str = "hash = hashFields(hash, getExtensionFields());\n";
    text_27._M_len = 0x2f;
    io::Printer::Print<>(printer,text_27);
  }
  text_28._M_str = "hash = (29 * hash) + getUnknownFields().hashCode();\n";
  text_28._M_len = 0x34;
  io::Printer::Print<>(printer,text_28);
  text_29._M_str = "memoizedHashCode = hash;\nreturn hash;\n";
  text_29._M_len = 0x26;
  io::Printer::Print<>(printer,text_29);
  io::Printer::Outdent(printer);
  text_30._M_str = "}\n\n";
  text_30._M_len = 3;
  io::Printer::Print<>(printer,text_30);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateEqualsAndHashCode(
    io::Printer* printer) {
  printer->Print(
      "@java.lang.Override\n"
      "public boolean equals(");
  if (!context_->options().opensource_runtime) {
    printer->Print(
        "@com.google.protobuf.Internal.ProtoMethodAcceptsNullParameter\n");
  }
  printer->Print("final java.lang.Object obj) {\n");
  printer->Indent();
  printer->Print(
      "if (obj == this) {\n"
      " return true;\n"
      "}\n"
      "if (!(obj instanceof $classname$)) {\n"
      // don't simply return false because mutable and immutable types
      // can be equal
      "  return super.equals(obj);\n"
      "}\n"
      "$classname$ other = ($classname$) obj;\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (!IsRealOneof(field)) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      if (field->has_presence()) {
        printer->Print(
            "if (has$name$() != other.has$name$()) return false;\n"
            "if (has$name$()) {\n",
            "name", info->capitalized_name);
        printer->Indent();
      }
      field_generators_.get(field).GenerateEqualsCode(printer);
      if (field->has_presence()) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // Compare oneofs.
  for (const auto& kv : oneofs_) {
    const OneofDescriptor* oneof = kv.second;
    printer->Print(
        "if (!get$oneof_capitalized_name$Case().equals("
        "other.get$oneof_capitalized_name$Case())) return false;\n",
        "oneof_capitalized_name",
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name);
    printer->Print("switch ($oneof_name$Case_) {\n", "oneof_name",
                   context_->GetOneofGeneratorInfo(oneof)->name);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("case $field_number$:\n", "field_number",
                     absl::StrCat(field->number()));
      printer->Indent();
      field_generators_.get(field).GenerateEqualsCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Print(
        "case 0:\n"
        "default:\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  // Always consider unknown fields for equality. This will sometimes return
  // false for non-canonical ordering when running in LITE_RUNTIME but it's
  // the best we can do.
  printer->Print(
      "if (!getUnknownFields().equals(other.getUnknownFields())) return "
      "false;\n");
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "if (!getExtensionFields().equals(other.getExtensionFields()))\n"
        "  return false;\n");
  }
  printer->Print("return true;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  printer->Print(
      "@java.lang.Override\n"
      "public int hashCode() {\n");
  printer->Indent();
  printer->Print("if (memoizedHashCode != 0) {\n");
  printer->Indent();
  printer->Print("return memoizedHashCode;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "int hash = 41;\n");

  // If we output a getDescriptor() method, use that as it is more efficient.
  if (descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print("hash = (19 * hash) + getDescriptorForType().hashCode();\n");
  } else {
    printer->Print("hash = (19 * hash) + getDescriptor().hashCode();\n");
  }

  // hashCode non-oneofs.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (!IsRealOneof(field)) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      if (field->has_presence()) {
        printer->Print("if (has$name$()) {\n", "name", info->capitalized_name);
        printer->Indent();
      }
      field_generators_.get(field).GenerateHashCode(printer);
      if (field->has_presence()) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // hashCode oneofs.
  for (const auto& kv : oneofs_) {
    const OneofDescriptor* oneof = kv.second;
    printer->Print("switch ($oneof_name$Case_) {\n", "oneof_name",
                   context_->GetOneofGeneratorInfo(oneof)->name);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("case $field_number$:\n", "field_number",
                     absl::StrCat(field->number()));
      printer->Indent();
      field_generators_.get(field).GenerateHashCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Print(
        "case 0:\n"
        "default:\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("hash = hashFields(hash, getExtensionFields());\n");
  }

  printer->Print("hash = (29 * hash) + getUnknownFields().hashCode();\n");
  printer->Print(
      "memoizedHashCode = hash;\n"
      "return hash;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");
}